

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# capture.h
# Opt level: O0

void __thiscall server::captureservmode::regenowners(captureservmode *this,baseinfo *b,int ticks)

{
  uint uVar1;
  uint uVar2;
  int iVar3;
  clientinfo *pcVar4;
  bool bVar5;
  bool bVar6;
  int iVar7;
  clientinfo **ppcVar8;
  int local_50;
  int ammotype;
  bool notify;
  clientinfo *ci;
  int i;
  int ticks_local;
  baseinfo *b_local;
  captureservmode *this_local;
  
  for (ci._0_4_ = 0;
      iVar7 = vector<server::clientinfo_*>::length((vector<server::clientinfo_*> *)clients),
      (int)ci < iVar7; ci._0_4_ = (int)ci + 1) {
    ppcVar8 = vector<server::clientinfo_*>::operator[]
                        ((vector<server::clientinfo_*> *)clients,(int)ci);
    pcVar4 = *ppcVar8;
    if (((((pcVar4->state).state == 0) && (pcVar4->team[0] != '\0')) &&
        (iVar7 = strcmp(pcVar4->team,b->owner), iVar7 == 0)) &&
       (bVar5 = insidebase(this,b,&(pcVar4->state).o), bVar5)) {
      bVar5 = (pcVar4->state).super_fpsstate.health < (pcVar4->state).super_fpsstate.maxhealth;
      if (bVar5) {
        iVar7 = min<int>((pcVar4->state).super_fpsstate.health + ticks * 10,
                         (pcVar4->state).super_fpsstate.maxhealth);
        (pcVar4->state).super_fpsstate.health = iVar7;
      }
      if (((pcVar4->state).super_fpsstate.armourtype != 1) ||
         ((pcVar4->state).super_fpsstate.armour < itemstats[8].max)) {
        if ((pcVar4->state).super_fpsstate.armourtype != 1) {
          (pcVar4->state).super_fpsstate.armourtype = 1;
          (pcVar4->state).super_fpsstate.armour = 0;
        }
        iVar7 = min<int>((pcVar4->state).super_fpsstate.armour + ticks * 10,itemstats[8].max);
        (pcVar4->state).super_fpsstate.armour = iVar7;
        bVar5 = true;
      }
      bVar6 = baseinfo::valid(b);
      if ((bVar6) &&
         (bVar6 = fpsstate::hasmaxammo(&(pcVar4->state).super_fpsstate,b->ammotype + 7), !bVar6)) {
        fpsstate::addammo(&(pcVar4->state).super_fpsstate,b->ammotype,ticks * 0x14,100);
        bVar5 = true;
      }
      if (bVar5) {
        uVar1 = pcVar4->clientnum;
        uVar2 = (pcVar4->state).super_fpsstate.health;
        iVar7 = (pcVar4->state).super_fpsstate.armour;
        iVar3 = b->ammotype;
        bVar5 = baseinfo::valid(b);
        if (bVar5) {
          local_50 = (pcVar4->state).super_fpsstate.ammo[b->ammotype];
        }
        else {
          local_50 = 0;
        }
        sendf(-1,1,"ri6",0x45,(ulong)uVar1,(ulong)uVar2,iVar7,iVar3,local_50);
      }
    }
  }
  return;
}

Assistant:

loopv(clients)
        {
            clientinfo *ci = clients[i];
            if(ci->state.state==CS_ALIVE && ci->team[0] && !strcmp(ci->team, b.owner) && insidebase(b, ci->state.o))
            {
                bool notify = false;
                if(ci->state.health < ci->state.maxhealth)
                {
                    ci->state.health = min(ci->state.health + ticks*REGENHEALTH, ci->state.maxhealth);
                    notify = true;
                }
                if(ci->state.armourtype != A_GREEN || ci->state.armour < itemstats[I_GREENARMOUR-I_SHELLS].max)
                {
                    if(ci->state.armourtype != A_GREEN)
                    {
                        ci->state.armourtype = A_GREEN;
                        ci->state.armour = 0;
                    }
                    ci->state.armour = min(ci->state.armour + ticks*REGENARMOUR, itemstats[I_GREENARMOUR-I_SHELLS].max);
                    notify = true;
                }
                if(b.valid())
                {
                    int ammotype = b.ammotype-1+I_SHELLS;
                    if(!ci->state.hasmaxammo(ammotype))
                    {
                        ci->state.addammo(b.ammotype, ticks*REGENAMMO, 100);
                        notify = true;
                    }
                }
                if(notify)
                    sendf(-1, 1, "ri6", N_BASEREGEN, ci->clientnum, ci->state.health, ci->state.armour, b.ammotype, b.valid() ? ci->state.ammo[b.ammotype] : 0);
            }
        }